

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  byte bVar9;
  BVH *bvh;
  NodeRef root;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  size_t k;
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vbool<4> vVar24;
  char cVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  size_t mask;
  ulong uVar29;
  undefined4 uVar30;
  ulong uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  ulong uVar33;
  NodeRef *pNVar34;
  bool bVar35;
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi_1;
  undefined1 auVar61 [16];
  vint4 bi_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar70;
  float fVar71;
  vint4 ai_2;
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vfloat4 a0;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar84;
  float fVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  float fVar87;
  float fVar94;
  float fVar95;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  undefined1 auVar93 [64];
  float fVar97;
  float fVar101;
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar109 [64];
  
  auVar13 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar49 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar108 = vpcmpeqd_avx(auVar49,(undefined1  [16])valid_i->field_0);
    auVar49 = *(undefined1 (*) [16])(ray + 0x80);
    auVar46 = ZEXT816(0) << 0x40;
    auVar52 = vcmpps_avx(auVar49,auVar46,5);
    auVar52 = vandps_avx(auVar52,auVar108);
    uVar26 = vmovmskps_avx(auVar52);
    if (uVar26 != 0) {
      uVar29 = (ulong)(uVar26 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar62._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar62._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar62._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar62._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar108 = vrsqrtps_avx(auVar62);
      fVar67 = auVar108._0_4_;
      fVar70 = auVar108._4_4_;
      fVar71 = auVar108._8_4_;
      fVar72 = auVar108._12_4_;
      pre.depth_scale.field_0.v[0] = fVar67 * 1.5 + fVar67 * fVar67 * fVar67 * auVar62._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar70 * 1.5 + fVar70 * fVar70 * fVar70 * auVar62._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar71 * 1.5 + fVar71 * fVar71 * fVar71 * auVar62._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar72 * 1.5 + fVar72 * fVar72 * fVar72 * auVar62._12_4_ * -0.5
      ;
      auVar108._8_4_ = 0x80000000;
      auVar108._0_8_ = 0x8000000080000000;
      auVar108._12_4_ = 0x80000000;
      auVar109 = ZEXT1664(auVar108);
      do {
        lVar12 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x50)),0x1c);
        auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x60)),0x28);
        fVar67 = *(float *)((long)pre.ray_space + lVar12 * 4 + -0x10);
        auVar77._0_4_ = auVar62._0_4_ * fVar67;
        auVar77._4_4_ = auVar62._4_4_ * fVar67;
        auVar77._8_4_ = auVar62._8_4_ * fVar67;
        auVar77._12_4_ = auVar62._12_4_ * fVar67;
        auVar73 = vshufpd_avx(auVar77,auVar77,1);
        auVar62 = vmovshdup_avx(auVar77);
        auVar88._0_4_ = auVar62._0_4_ ^ 0x80000000;
        auVar62 = vunpckhps_avx(auVar77,auVar46);
        auVar88._4_12_ = ZEXT812(0) << 0x20;
        auVar81 = vshufps_avx(auVar62,auVar88,0x41);
        auVar80._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
        auVar80._8_8_ = auVar73._8_8_ ^ auVar108._8_8_;
        auVar80 = vinsertps_avx(auVar80,auVar77,0x2a);
        auVar62 = vdpps_avx(auVar81,auVar81,0x7f);
        auVar73 = vdpps_avx(auVar80,auVar80,0x7f);
        auVar62 = vcmpps_avx(auVar73,auVar62,1);
        auVar62 = vshufps_avx(auVar62,auVar62,0);
        auVar62 = vblendvps_avx(auVar80,auVar81,auVar62);
        auVar73 = vdpps_avx(auVar62,auVar62,0x7f);
        auVar80 = vrsqrtss_avx(auVar73,auVar73);
        fVar70 = auVar80._0_4_;
        auVar73 = ZEXT416((uint)(fVar70 * 1.5 - auVar73._0_4_ * 0.5 * fVar70 * fVar70 * fVar70));
        auVar73 = vshufps_avx(auVar73,auVar73,0);
        auVar81._0_4_ = auVar62._0_4_ * auVar73._0_4_;
        auVar81._4_4_ = auVar62._4_4_ * auVar73._4_4_;
        auVar81._8_4_ = auVar62._8_4_ * auVar73._8_4_;
        auVar81._12_4_ = auVar62._12_4_ * auVar73._12_4_;
        auVar62 = vshufps_avx(auVar81,auVar81,0xc9);
        auVar73 = vshufps_avx(auVar77,auVar77,0xc9);
        auVar98._0_4_ = auVar73._0_4_ * auVar81._0_4_;
        auVar98._4_4_ = auVar73._4_4_ * auVar81._4_4_;
        auVar98._8_4_ = auVar73._8_4_ * auVar81._8_4_;
        auVar98._12_4_ = auVar73._12_4_ * auVar81._12_4_;
        auVar89._0_4_ = auVar77._0_4_ * auVar62._0_4_;
        auVar89._4_4_ = auVar77._4_4_ * auVar62._4_4_;
        auVar89._8_4_ = auVar77._8_4_ * auVar62._8_4_;
        auVar89._12_4_ = auVar77._12_4_ * auVar62._12_4_;
        auVar62 = vsubps_avx(auVar89,auVar98);
        auVar80 = vshufps_avx(auVar62,auVar62,0xc9);
        auVar62 = vdpps_avx(auVar80,auVar80,0x7f);
        auVar73 = vrsqrtss_avx(auVar62,auVar62);
        fVar70 = auVar73._0_4_;
        auVar62 = ZEXT416((uint)(fVar70 * 1.5 - auVar62._0_4_ * 0.5 * fVar70 * fVar70 * fVar70));
        auVar62 = vshufps_avx(auVar62,auVar62,0);
        auVar90._0_4_ = auVar62._0_4_ * auVar80._0_4_;
        auVar90._4_4_ = auVar62._4_4_ * auVar80._4_4_;
        auVar90._8_4_ = auVar62._8_4_ * auVar80._8_4_;
        auVar90._12_4_ = auVar62._12_4_ * auVar80._12_4_;
        auVar73._0_4_ = auVar77._0_4_ * fVar67;
        auVar73._4_4_ = auVar77._4_4_ * fVar67;
        auVar73._8_4_ = auVar77._8_4_ * fVar67;
        auVar73._12_4_ = auVar77._12_4_ * fVar67;
        auVar80 = vunpcklps_avx(auVar81,auVar73);
        auVar62 = vunpckhps_avx(auVar81,auVar73);
        auVar81 = vunpcklps_avx(auVar90,auVar46);
        auVar73 = vunpckhps_avx(auVar90,auVar46);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar62,auVar73);
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar80,auVar81);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar80,auVar81);
        pre.ray_space[lVar12].vx.field_0 = aVar16;
        pre.ray_space[lVar12].vy.field_0 = aVar14;
        pre.ray_space[lVar12].vz.field_0 = aVar15;
        uVar29 = uVar29 & uVar29 - 1;
      } while (uVar29 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      tray.org.field_0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      tray.org.field_0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      tray.org.field_0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar108 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar68);
      auVar74._8_4_ = 0x219392ef;
      auVar74._0_8_ = 0x219392ef219392ef;
      auVar74._12_4_ = 0x219392ef;
      auVar46 = vcmpps_avx(auVar108,auVar74,1);
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = &DAT_3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar73 = vdivps_avx(auVar78,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar108 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar68);
      auVar62 = vcmpps_avx(auVar108,auVar74,1);
      auVar80 = vdivps_avx(auVar78,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar108 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar68);
      auVar108 = vcmpps_avx(auVar108,auVar74,1);
      auVar81 = vdivps_avx(auVar78,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar75._8_4_ = 0x5d5e0b6b;
      auVar75._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar75._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar73,auVar75,auVar46);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar80,auVar75,auVar62);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar81,auVar75,auVar108);
      auVar46 = ZEXT816(0) << 0x20;
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar46,1);
      auVar63._8_4_ = 0x10;
      auVar63._0_8_ = 0x1000000010;
      auVar63._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar108,auVar63);
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar46,5);
      auVar64._8_4_ = 0x20;
      auVar64._0_8_ = 0x2000000020;
      auVar64._12_4_ = 0x20;
      auVar69._8_4_ = 0x30;
      auVar69._0_8_ = 0x3000000030;
      auVar69._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar69,auVar64,auVar108)
      ;
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar46,5);
      auVar53._8_4_ = 0x40;
      auVar53._0_8_ = 0x4000000040;
      auVar53._12_4_ = 0x40;
      auVar58._8_4_ = 0x50;
      auVar58._0_8_ = 0x5000000050;
      auVar58._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar58,auVar53,auVar108)
      ;
      auVar108 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar46);
      auVar49 = vmaxps_avx(auVar49,auVar46);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar93 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar108,auVar52);
      auVar46._8_4_ = 0xff800000;
      auVar46._0_8_ = 0xff800000ff800000;
      auVar46._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar46,auVar49,auVar52);
      auVar49 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar52._0_4_ ^ auVar49._0_4_;
      terminated.field_0._4_4_ = auVar52._4_4_ ^ auVar49._4_4_;
      terminated.field_0._8_4_ = auVar52._8_4_ ^ auVar49._8_4_;
      terminated.field_0._12_4_ = auVar52._12_4_ ^ auVar49._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar32 = &((vfloat<4> *)paVar32)[-1].field_0;
        root.ptr = pNVar34[-1].ptr;
        pNVar34 = pNVar34 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0032dcf3:
          iVar28 = 3;
        }
        else {
          aVar104 = *paVar32;
          auVar49 = vcmpps_avx((undefined1  [16])aVar104,(undefined1  [16])tray.tfar.field_0,1);
          uVar27 = vmovmskps_avx(auVar49);
          if (uVar27 == 0) {
            iVar28 = 2;
          }
          else {
            uVar29 = (ulong)(uVar27 & 0xff);
            uVar27 = POPCOUNT(uVar27 & 0xff);
            iVar28 = 0;
            if (uVar27 <= uVar26) {
              do {
                k = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> k & 1) == 0; k = k + 1) {
                  }
                }
                bVar35 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
                if (bVar35) {
                  terminated.field_0.i[k] = -1;
                }
                uVar29 = uVar29 & uVar29 - 1;
              } while (uVar29 != 0);
              auVar49 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar28 = 3;
              auVar109 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar49[0xf] < '\0') {
                auVar49._8_4_ = 0xff800000;
                auVar49._0_8_ = 0xff800000ff800000;
                auVar49._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                                   (undefined1  [16])terminated.field_0);
                iVar28 = 2;
              }
            }
            vVar24.field_0 = terminated.field_0;
            if (uVar26 < uVar27) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar49 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                         (undefined1  [16])aVar104,6);
                    if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar49[0xf]) {
                      iVar28 = 2;
                    }
                    else {
                      bVar9 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar11 = This->leafIntersector;
                      local_17b8 = auVar13._0_8_;
                      uStack_17b0 = auVar13._8_8_;
                      valid_o.field_0._0_8_ = local_17b8;
                      valid_o.field_0._8_8_ = uStack_17b0;
                      uVar27 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar27 ^ 0xf) != 0) {
                        uVar29 = (ulong)(byte)(uVar27 ^ 0xf);
                        do {
                          lVar12 = 0;
                          if (uVar29 != 0) {
                            for (; (uVar29 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                            }
                          }
                          cVar25 = (**(code **)((long)pvVar11 + (ulong)bVar9 * 0x40 + 0x18))
                                             (&pre,ray,lVar12,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar25 != '\0') {
                            valid_o.field_0.i[lVar12] = -1;
                          }
                          uVar29 = uVar29 & uVar29 - 1;
                        } while (uVar29 != 0);
                      }
                      auVar20._8_8_ = valid_o.field_0._8_8_;
                      auVar20._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar24.field_0,auVar20);
                      auVar49 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar49[0xf]) {
                        iVar28 = 3;
                      }
                      else {
                        auVar57._8_4_ = 0xff800000;
                        auVar57._0_8_ = 0xff800000ff800000;
                        auVar57._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar57,
                                           (undefined1  [16])terminated.field_0);
                        iVar28 = 0;
                      }
                    }
                    auVar109 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    break;
                  }
                  goto LAB_0032dcf3;
                }
                uVar31 = root.ptr & 0xfffffffffffffff0;
                auVar106 = ZEXT1664(auVar93._0_16_);
                uVar29 = 0;
                uVar33 = 8;
                do {
                  uVar10 = *(ulong *)(uVar31 + uVar29 * 8);
                  if (uVar10 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar30 = *(undefined4 *)(root.ptr + 0x20 + uVar29 * 4);
                      auVar36._4_4_ = uVar30;
                      auVar36._0_4_ = uVar30;
                      auVar36._8_4_ = uVar30;
                      auVar36._12_4_ = uVar30;
                      auVar21._4_4_ = tray.org.field_0._4_4_;
                      auVar21._0_4_ = tray.org.field_0._0_4_;
                      auVar21._8_4_ = tray.org.field_0._8_4_;
                      auVar21._12_4_ = tray.org.field_0._12_4_;
                      auVar22._4_4_ = tray.org.field_0._20_4_;
                      auVar22._0_4_ = tray.org.field_0._16_4_;
                      auVar22._8_4_ = tray.org.field_0._24_4_;
                      auVar22._12_4_ = tray.org.field_0._28_4_;
                      auVar23._4_4_ = tray.org.field_0._36_4_;
                      auVar23._0_4_ = tray.org.field_0._32_4_;
                      auVar23._8_4_ = tray.org.field_0._40_4_;
                      auVar23._12_4_ = tray.org.field_0._44_4_;
                      auVar49 = vsubps_avx(auVar36,auVar21);
                      auVar65._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar49._0_4_;
                      auVar65._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar49._4_4_;
                      auVar65._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar49._8_4_;
                      auVar65._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar49._12_4_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x40 + uVar29 * 4);
                      auVar37._4_4_ = uVar30;
                      auVar37._0_4_ = uVar30;
                      auVar37._8_4_ = uVar30;
                      auVar37._12_4_ = uVar30;
                      auVar49 = vsubps_avx(auVar37,auVar22);
                      auVar76._0_4_ = tray.rdir.field_0._16_4_ * auVar49._0_4_;
                      auVar76._4_4_ = tray.rdir.field_0._20_4_ * auVar49._4_4_;
                      auVar76._8_4_ = tray.rdir.field_0._24_4_ * auVar49._8_4_;
                      auVar76._12_4_ = tray.rdir.field_0._28_4_ * auVar49._12_4_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x60 + uVar29 * 4);
                      auVar38._4_4_ = uVar30;
                      auVar38._0_4_ = uVar30;
                      auVar38._8_4_ = uVar30;
                      auVar38._12_4_ = uVar30;
                      auVar49 = vsubps_avx(auVar38,auVar23);
                      auVar82._0_4_ = tray.rdir.field_0._32_4_ * auVar49._0_4_;
                      auVar82._4_4_ = tray.rdir.field_0._36_4_ * auVar49._4_4_;
                      auVar82._8_4_ = tray.rdir.field_0._40_4_ * auVar49._8_4_;
                      auVar82._12_4_ = tray.rdir.field_0._44_4_ * auVar49._12_4_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x30 + uVar29 * 4);
                      auVar39._4_4_ = uVar30;
                      auVar39._0_4_ = uVar30;
                      auVar39._8_4_ = uVar30;
                      auVar39._12_4_ = uVar30;
                      auVar49 = vsubps_avx(auVar39,auVar21);
                      auVar47._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar49._0_4_;
                      auVar47._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar49._4_4_;
                      auVar47._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar49._8_4_;
                      auVar47._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar49._12_4_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x50 + uVar29 * 4);
                      auVar40._4_4_ = uVar30;
                      auVar40._0_4_ = uVar30;
                      auVar40._8_4_ = uVar30;
                      auVar40._12_4_ = uVar30;
                      auVar49 = vsubps_avx(auVar40,auVar22);
                      auVar54._0_4_ = tray.rdir.field_0._16_4_ * auVar49._0_4_;
                      auVar54._4_4_ = tray.rdir.field_0._20_4_ * auVar49._4_4_;
                      auVar54._8_4_ = tray.rdir.field_0._24_4_ * auVar49._8_4_;
                      auVar54._12_4_ = tray.rdir.field_0._28_4_ * auVar49._12_4_;
                      uVar30 = *(undefined4 *)(root.ptr + 0x70 + uVar29 * 4);
                      auVar41._4_4_ = uVar30;
                      auVar41._0_4_ = uVar30;
                      auVar41._8_4_ = uVar30;
                      auVar41._12_4_ = uVar30;
                      auVar49 = vsubps_avx(auVar41,auVar23);
                      auVar59._0_4_ = tray.rdir.field_0._32_4_ * auVar49._0_4_;
                      auVar59._4_4_ = tray.rdir.field_0._36_4_ * auVar49._4_4_;
                      auVar59._8_4_ = tray.rdir.field_0._40_4_ * auVar49._8_4_;
                      auVar59._12_4_ = tray.rdir.field_0._44_4_ * auVar49._12_4_;
                      auVar49 = vminps_avx(auVar65,auVar47);
                      auVar108 = vminps_avx(auVar76,auVar54);
                      auVar49 = vmaxps_avx(auVar49,auVar108);
                      auVar108 = vminps_avx(auVar82,auVar59);
                      auVar49 = vmaxps_avx(auVar49,auVar108);
                      auVar42._0_4_ = auVar49._0_4_ * 0.99999964;
                      auVar42._4_4_ = auVar49._4_4_ * 0.99999964;
                      auVar42._8_4_ = auVar49._8_4_ * 0.99999964;
                      auVar42._12_4_ = auVar49._12_4_ * 0.99999964;
                      auVar49 = vmaxps_avx(auVar65,auVar47);
                      auVar108 = vmaxps_avx(auVar76,auVar54);
                      auVar108 = vminps_avx(auVar49,auVar108);
                      auVar49 = vmaxps_avx(auVar82,auVar59);
                      auVar108 = vminps_avx(auVar108,auVar49);
                      auVar49 = vmaxps_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                      auVar48._0_4_ = auVar108._0_4_ * 1.0000004;
                      auVar48._4_4_ = auVar108._4_4_ * 1.0000004;
                      auVar48._8_4_ = auVar108._8_4_ * 1.0000004;
                      auVar48._12_4_ = auVar108._12_4_ * 1.0000004;
                      auVar108 = vminps_avx(auVar48,(undefined1  [16])tray.tfar.field_0);
                    }
                    else {
                      fVar67 = *(float *)(uVar31 + 0x20 + uVar29 * 4);
                      fVar70 = *(float *)(uVar31 + 0x30 + uVar29 * 4);
                      fVar71 = *(float *)(uVar31 + 0x40 + uVar29 * 4);
                      fVar72 = *(float *)(uVar31 + 0x50 + uVar29 * 4);
                      fVar1 = *(float *)(uVar31 + 0x60 + uVar29 * 4);
                      fVar2 = *(float *)(uVar31 + 0x70 + uVar29 * 4);
                      fVar3 = *(float *)(uVar31 + 0x80 + uVar29 * 4);
                      fVar4 = *(float *)(uVar31 + 0x90 + uVar29 * 4);
                      fVar5 = *(float *)(uVar31 + 0xa0 + uVar29 * 4);
                      auVar91._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar67 +
                           (float)tray.dir.field_0._16_4_ * fVar72 +
                           fVar3 * (float)tray.dir.field_0._32_4_;
                      auVar91._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar67 +
                           (float)tray.dir.field_0._20_4_ * fVar72 +
                           fVar3 * (float)tray.dir.field_0._36_4_;
                      auVar91._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar67 +
                           (float)tray.dir.field_0._24_4_ * fVar72 +
                           fVar3 * (float)tray.dir.field_0._40_4_;
                      auVar91._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar67 +
                           (float)tray.dir.field_0._28_4_ * fVar72 +
                           fVar3 * (float)tray.dir.field_0._44_4_;
                      auVar99._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar70 +
                           (float)tray.dir.field_0._16_4_ * fVar1 +
                           (float)tray.dir.field_0._32_4_ * fVar4;
                      auVar99._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar70 +
                           (float)tray.dir.field_0._20_4_ * fVar1 +
                           (float)tray.dir.field_0._36_4_ * fVar4;
                      auVar99._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar70 +
                           (float)tray.dir.field_0._24_4_ * fVar1 +
                           (float)tray.dir.field_0._40_4_ * fVar4;
                      auVar99._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar70 +
                           (float)tray.dir.field_0._28_4_ * fVar1 +
                           (float)tray.dir.field_0._44_4_ * fVar4;
                      fVar6 = *(float *)(uVar31 + 0xb0 + uVar29 * 4);
                      auVar83._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar71 +
                           (float)tray.dir.field_0._16_4_ * fVar2 +
                           (float)tray.dir.field_0._32_4_ * fVar5;
                      auVar83._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar71 +
                           (float)tray.dir.field_0._20_4_ * fVar2 +
                           (float)tray.dir.field_0._36_4_ * fVar5;
                      auVar83._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar71 +
                           (float)tray.dir.field_0._24_4_ * fVar2 +
                           (float)tray.dir.field_0._40_4_ * fVar5;
                      auVar83._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar71 +
                           (float)tray.dir.field_0._28_4_ * fVar2 +
                           (float)tray.dir.field_0._44_4_ * fVar5;
                      auVar107._8_4_ = 0x7fffffff;
                      auVar107._0_8_ = 0x7fffffff7fffffff;
                      auVar107._12_4_ = 0x7fffffff;
                      auVar49 = vandps_avx(auVar91,auVar107);
                      auVar43._8_4_ = 0x219392ef;
                      auVar43._0_8_ = 0x219392ef219392ef;
                      auVar43._12_4_ = 0x219392ef;
                      auVar49 = vcmpps_avx(auVar49,auVar43,1);
                      auVar108 = vblendvps_avx(auVar91,auVar43,auVar49);
                      auVar49 = vandps_avx(auVar99,auVar107);
                      auVar49 = vcmpps_avx(auVar49,auVar43,1);
                      auVar46 = vblendvps_avx(auVar99,auVar43,auVar49);
                      auVar49 = vandps_avx(auVar83,auVar107);
                      auVar49 = vcmpps_avx(auVar49,auVar43,1);
                      auVar49 = vblendvps_avx(auVar83,auVar43,auVar49);
                      auVar62 = vrcpps_avx(auVar108);
                      fVar79 = auVar62._0_4_;
                      auVar92._0_4_ = fVar79 * auVar108._0_4_;
                      fVar84 = auVar62._4_4_;
                      auVar92._4_4_ = fVar84 * auVar108._4_4_;
                      fVar85 = auVar62._8_4_;
                      auVar92._8_4_ = fVar85 * auVar108._8_4_;
                      fVar86 = auVar62._12_4_;
                      auVar92._12_4_ = fVar86 * auVar108._12_4_;
                      auVar44._8_4_ = 0x3f800000;
                      auVar44._0_8_ = &DAT_3f8000003f800000;
                      auVar44._12_4_ = 0x3f800000;
                      auVar108 = vsubps_avx(auVar44,auVar92);
                      fVar79 = fVar79 + fVar79 * auVar108._0_4_;
                      fVar84 = fVar84 + fVar84 * auVar108._4_4_;
                      fVar85 = fVar85 + fVar85 * auVar108._8_4_;
                      fVar86 = fVar86 + fVar86 * auVar108._12_4_;
                      auVar108 = vrcpps_avx(auVar46);
                      fVar87 = auVar108._0_4_;
                      auVar100._0_4_ = fVar87 * auVar46._0_4_;
                      fVar94 = auVar108._4_4_;
                      auVar100._4_4_ = fVar94 * auVar46._4_4_;
                      fVar95 = auVar108._8_4_;
                      auVar100._8_4_ = fVar95 * auVar46._8_4_;
                      fVar96 = auVar108._12_4_;
                      auVar100._12_4_ = fVar96 * auVar46._12_4_;
                      auVar108 = vsubps_avx(auVar44,auVar100);
                      fVar87 = fVar87 + fVar87 * auVar108._0_4_;
                      fVar94 = fVar94 + fVar94 * auVar108._4_4_;
                      fVar95 = fVar95 + fVar95 * auVar108._8_4_;
                      fVar96 = fVar96 + fVar96 * auVar108._12_4_;
                      auVar108 = vrcpps_avx(auVar49);
                      fVar97 = auVar108._0_4_;
                      auVar105._0_4_ = fVar97 * auVar49._0_4_;
                      fVar101 = auVar108._4_4_;
                      auVar105._4_4_ = fVar101 * auVar49._4_4_;
                      fVar102 = auVar108._8_4_;
                      auVar105._8_4_ = fVar102 * auVar49._8_4_;
                      fVar103 = auVar108._12_4_;
                      auVar105._12_4_ = fVar103 * auVar49._12_4_;
                      auVar49 = vsubps_avx(auVar44,auVar105);
                      fVar97 = fVar97 + fVar97 * auVar49._0_4_;
                      fVar101 = fVar101 + fVar101 * auVar49._4_4_;
                      fVar102 = fVar102 + fVar102 * auVar49._8_4_;
                      fVar103 = fVar103 + fVar103 * auVar49._12_4_;
                      fVar7 = *(float *)(uVar31 + 0xc0 + uVar29 * 4);
                      auVar106 = ZEXT1664(auVar106._0_16_);
                      fVar8 = *(float *)(uVar31 + 0xd0 + uVar29 * 4);
                      uVar27 = auVar109._0_4_;
                      uVar17 = auVar109._4_4_;
                      uVar18 = auVar109._8_4_;
                      uVar19 = auVar109._12_4_;
                      auVar56._0_4_ =
                           (fVar67 * (float)tray.org.field_0._0_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._32_4_ +
                           (float)tray.org.field_0._16_4_ * fVar72) * (float)((uint)fVar79 ^ uVar27)
                      ;
                      auVar56._4_4_ =
                           (fVar67 * (float)tray.org.field_0._4_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._36_4_ +
                           (float)tray.org.field_0._20_4_ * fVar72) * (float)((uint)fVar84 ^ uVar17)
                      ;
                      auVar56._8_4_ =
                           (fVar67 * (float)tray.org.field_0._8_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._40_4_ +
                           (float)tray.org.field_0._24_4_ * fVar72) * (float)((uint)fVar85 ^ uVar18)
                      ;
                      auVar56._12_4_ =
                           (fVar67 * (float)tray.org.field_0._12_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._44_4_ +
                           (float)tray.org.field_0._28_4_ * fVar72) * (float)((uint)fVar86 ^ uVar19)
                      ;
                      auVar50._0_4_ =
                           (fVar70 * (float)tray.org.field_0._0_4_ +
                           (float)tray.org.field_0._16_4_ * fVar1 +
                           fVar7 + (float)tray.org.field_0._32_4_ * fVar4) *
                           (float)((uint)fVar87 ^ uVar27);
                      auVar50._4_4_ =
                           (fVar70 * (float)tray.org.field_0._4_4_ +
                           (float)tray.org.field_0._20_4_ * fVar1 +
                           fVar7 + (float)tray.org.field_0._36_4_ * fVar4) *
                           (float)((uint)fVar94 ^ uVar17);
                      auVar50._8_4_ =
                           (fVar70 * (float)tray.org.field_0._8_4_ +
                           (float)tray.org.field_0._24_4_ * fVar1 +
                           fVar7 + (float)tray.org.field_0._40_4_ * fVar4) *
                           (float)((uint)fVar95 ^ uVar18);
                      auVar50._12_4_ =
                           (fVar70 * (float)tray.org.field_0._12_4_ +
                           (float)tray.org.field_0._28_4_ * fVar1 +
                           fVar7 + (float)tray.org.field_0._44_4_ * fVar4) *
                           (float)((uint)fVar96 ^ uVar19);
                      auVar45._0_4_ =
                           ((float)tray.org.field_0._0_4_ * fVar71 +
                           (float)tray.org.field_0._16_4_ * fVar2 +
                           fVar8 + (float)tray.org.field_0._32_4_ * fVar5) *
                           (float)((uint)fVar97 ^ uVar27);
                      auVar45._4_4_ =
                           ((float)tray.org.field_0._4_4_ * fVar71 +
                           (float)tray.org.field_0._20_4_ * fVar2 +
                           fVar8 + (float)tray.org.field_0._36_4_ * fVar5) *
                           (float)((uint)fVar101 ^ uVar17);
                      auVar45._8_4_ =
                           ((float)tray.org.field_0._8_4_ * fVar71 +
                           (float)tray.org.field_0._24_4_ * fVar2 +
                           fVar8 + (float)tray.org.field_0._40_4_ * fVar5) *
                           (float)((uint)fVar102 ^ uVar18);
                      auVar45._12_4_ =
                           ((float)tray.org.field_0._12_4_ * fVar71 +
                           (float)tray.org.field_0._28_4_ * fVar2 +
                           fVar8 + (float)tray.org.field_0._44_4_ * fVar5) *
                           (float)((uint)fVar103 ^ uVar19);
                      auVar60._0_4_ = fVar79 + auVar56._0_4_;
                      auVar60._4_4_ = fVar84 + auVar56._4_4_;
                      auVar60._8_4_ = fVar85 + auVar56._8_4_;
                      auVar60._12_4_ = fVar86 + auVar56._12_4_;
                      auVar61._0_4_ = fVar87 + auVar50._0_4_;
                      auVar61._4_4_ = fVar94 + auVar50._4_4_;
                      auVar61._8_4_ = fVar95 + auVar50._8_4_;
                      auVar61._12_4_ = fVar96 + auVar50._12_4_;
                      auVar93 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar66._0_4_ = fVar97 + auVar45._0_4_;
                      auVar66._4_4_ = fVar101 + auVar45._4_4_;
                      auVar66._8_4_ = fVar102 + auVar45._8_4_;
                      auVar66._12_4_ = fVar103 + auVar45._12_4_;
                      auVar49 = vpminsd_avx(auVar56,auVar60);
                      auVar108 = vpminsd_avx(auVar50,auVar61);
                      auVar49 = vpmaxsd_avx(auVar49,auVar108);
                      auVar108 = vpminsd_avx(auVar45,auVar66);
                      auVar49 = vpmaxsd_avx(auVar49,auVar108);
                      auVar108 = vpmaxsd_avx(auVar56,auVar60);
                      auVar46 = vpmaxsd_avx(auVar50,auVar61);
                      auVar46 = vpminsd_avx(auVar108,auVar46);
                      auVar108 = vpmaxsd_avx(auVar45,auVar66);
                      auVar108 = vpminsd_avx(auVar46,auVar108);
                      auVar42._0_4_ = auVar49._0_4_ * 0.99999964;
                      auVar42._4_4_ = auVar49._4_4_ * 0.99999964;
                      auVar42._8_4_ = auVar49._8_4_ * 0.99999964;
                      auVar42._12_4_ = auVar49._12_4_ * 0.99999964;
                      auVar49 = vpmaxsd_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                      auVar51._0_4_ = auVar108._0_4_ * 1.0000004;
                      auVar51._4_4_ = auVar108._4_4_ * 1.0000004;
                      auVar51._8_4_ = auVar108._8_4_ * 1.0000004;
                      auVar51._12_4_ = auVar108._12_4_ * 1.0000004;
                      auVar108 = vpminsd_avx(auVar51,(undefined1  [16])tray.tfar.field_0);
                    }
                    auVar49 = vcmpps_avx(auVar49,auVar108,2);
                    auVar55._8_8_ = 0x100000001;
                    auVar55._0_8_ = 0x100000001;
                    if ((auVar55 & auVar49) != (undefined1  [16])0x0) {
                      auVar49 = vpslld_avx(auVar49,0x1f);
                      auVar49 = vblendvps_avx(auVar93._0_16_,auVar42,auVar49);
                      if (uVar33 != 8) {
                        pNVar34->ptr = uVar33;
                        pNVar34 = pNVar34 + 1;
                        *paVar32 = auVar106._0_16_;
                        paVar32 = paVar32 + 1;
                      }
                      auVar106 = ZEXT1664(auVar49);
                      uVar33 = uVar10;
                    }
                  }
                  aVar104 = auVar106._0_16_;
                } while ((uVar10 != 8) && (bVar35 = uVar29 < 3, uVar29 = uVar29 + 1, bVar35));
                iVar28 = 0;
                if (uVar33 == 8) {
LAB_0032dbb6:
                  bVar35 = false;
                  iVar28 = 4;
                }
                else {
                  auVar49 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar104
                                       ,6);
                  uVar30 = vmovmskps_avx(auVar49);
                  bVar35 = true;
                  if ((uint)POPCOUNT(uVar30) <= uVar26) {
                    pNVar34->ptr = uVar33;
                    pNVar34 = pNVar34 + 1;
                    *paVar32 = aVar104;
                    paVar32 = paVar32 + 1;
                    goto LAB_0032dbb6;
                  }
                }
                root.ptr = uVar33;
              } while (bVar35);
            }
          }
        }
      } while (iVar28 != 3);
      auVar13 = vandps_avx(auVar52,(undefined1  [16])terminated.field_0);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar13 = vmaskmovps_avx(auVar13,auVar52);
      *(undefined1 (*) [16])(ray + 0x80) = auVar13;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }